

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_formparse.c
# Opt level: O1

int tool_mime_stdin_seek(void *instream,curl_off_t offset,int whence)

{
  int iVar1;
  long lVar2;
  
  if (whence == 1) {
    lVar2 = 0x60;
  }
  else {
    if (whence != 2) goto LAB_0010da04;
    lVar2 = 0x58;
  }
  offset = offset + *(long *)((long)instream + lVar2);
LAB_0010da04:
  iVar1 = 2;
  if (-1 < offset) {
    if ((*(long *)((long)instream + 0x18) == 0) &&
       (iVar1 = fseek(_stdin,*(long *)((long)instream + 0x50) + offset,0), iVar1 != 0)) {
      return 2;
    }
    *(curl_off_t *)((long)instream + 0x60) = offset;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int tool_mime_stdin_seek(void *instream, curl_off_t offset, int whence)
{
  struct tool_mime *sip = (struct tool_mime *) instream;

  switch(whence) {
  case SEEK_CUR:
    offset += sip->curpos;
    break;
  case SEEK_END:
    offset += sip->size;
    break;
  }
  if(offset < 0)
    return CURL_SEEKFUNC_CANTSEEK;
  if(!sip->data) {
    if(fseek(stdin, (long) (offset + sip->origin), SEEK_SET))
      return CURL_SEEKFUNC_CANTSEEK;
  }
  sip->curpos = offset;
  return CURL_SEEKFUNC_OK;
}